

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
cbtBvhTriangleMeshShape::performRaycast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  cbtStridingMeshInterface *pcVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  float fVar8;
  PHY_ScalarType indicestype;
  int stride;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  cbtVector3 m_triangle [3];
  
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,nodeSubPart);
  pcVar2 = this->m_meshInterface;
  lVar5 = 0;
  do {
    if (indicestype == PHY_SHORT) {
      uVar6 = (uint)*(ushort *)(indexbase + lVar5 + (long)(indexstride * nodeTriangleIndex) + 4);
    }
    else {
      uVar6 = *(uint *)(indexbase + lVar5 * 2 + (long)(indexstride * nodeTriangleIndex) + 8);
    }
    lVar7 = (long)(int)uVar6 * (long)stride;
    if (type == PHY_FLOAT) {
      fVar3 = *(float *)(vertexbase + lVar7) * (pcVar2->m_scaling).m_floats[0];
      fVar4 = *(float *)(vertexbase + lVar7 + 4) * (pcVar2->m_scaling).m_floats[1];
      fVar8 = *(float *)(vertexbase + lVar7 + 8);
    }
    else {
      fVar3 = (float)*(double *)(vertexbase + lVar7) * (pcVar2->m_scaling).m_floats[0];
      fVar4 = (float)*(double *)(vertexbase + lVar7 + 8) * (pcVar2->m_scaling).m_floats[1];
      fVar8 = (float)*(double *)(vertexbase + lVar7 + 0x10);
    }
    fVar1 = (pcVar2->m_scaling).m_floats[2];
    m_triangle[2].m_floats[lVar5 * 2] = fVar3;
    m_triangle[2].m_floats[lVar5 * 2 + 1] = fVar4;
    m_triangle[2].m_floats[lVar5 * 2 + 2] = fVar8 * fVar1;
    m_triangle[2].m_floats[lVar5 * 2 + 3] = 0.0;
    lVar5 = lVar5 + -2;
  } while (lVar5 != -6);
  (*this->m_callback->_vptr_cbtTriangleCallback[2])
            (this->m_callback,m_triangle,nodeSubPart,(ulong)(uint)nodeTriangleIndex);
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])(this->m_meshInterface,nodeSubPart);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			cbtVector3 m_triangle[3];
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(graphicsbase[0] * meshScaling.getX(), graphicsbase[1] * meshScaling.getY(), graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(cbtScalar(graphicsbase[0]) * meshScaling.getX(), cbtScalar(graphicsbase[1]) * meshScaling.getY(), cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}